

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O0

void __thiscall SSTable::removeFromDisk(SSTable *this)

{
  vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *this_00;
  vector<SSTableIndexItem,_std::allocator<SSTableIndexItem>_> *this_01;
  SSTable *this_local;
  
  std::filesystem::remove(&this->file);
  this_00 = this->data;
  if (this_00 != (vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *)0x0) {
    std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::~vector(this_00);
    operator_delete(this_00,0x18);
  }
  if (this->header != (SSTableHeader *)0x0) {
    operator_delete(this->header,0x20);
  }
  this_01 = this->index;
  if (this_01 != (vector<SSTableIndexItem,_std::allocator<SSTableIndexItem>_> *)0x0) {
    std::vector<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>::~vector(this_01);
    operator_delete(this_01,0x18);
  }
  this->data = (SSTableData *)0x0;
  this->header = (SSTableHeader *)0x0;
  this->index = (SSTableIndex *)0x0;
  return;
}

Assistant:

void SSTable::removeFromDisk() {
    remove(file);
    delete data;
    delete header;
    delete index;
    data = nullptr;
    header = nullptr;
    index = nullptr;
}